

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

DetachedStateBase * Js::JavascriptOperators::DetachVarAndGetState(Var var,bool queueForDelayFree)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ArrayBuffer *this;
  ArrayBufferDetachedStateBase *pAVar6;
  RecyclableObject *pRVar7;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00ab445f;
    *puVar5 = 0;
LAB_00ab4301:
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(var);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00ab445f;
      *puVar5 = 0;
    }
    TVar1 = ((pRVar7->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_ArrayBuffer) {
        this = VarTo<Js::ArrayBuffer>(var);
        pAVar6 = ArrayBuffer::DetachAndGetState(this,queueForDelayFree);
        return &pAVar6->super_DetachedStateBase;
      }
    }
    else {
      BVar4 = RecyclableObject::IsExternal(pRVar7);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        fileName = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        error = "(typeId < TypeIds_Limit || obj->IsExternal())";
        message = "GetTypeId aValue has invalid TypeId";
        lineNumber = 0xe;
        goto LAB_00ab43e0;
      }
    }
  }
  else if (((ulong)var & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)var & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)var >> 0x32 == 0 && ((ulong)var & 0xffff000000000000) != 0x1000000000000)
    goto LAB_00ab4301;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00ab43e0:
    bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
    if (!bVar3) goto LAB_00ab445f;
    *puVar5 = 0;
  }
  pRVar7 = VarTo<Js::RecyclableObject>(var);
  BVar4 = RecyclableObject::IsExternal(pRVar7);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x16ce,"(false)",
                                "We should explicitly have a case statement for each non-external object that can be detached."
                               );
    if (!bVar3) {
LAB_00ab445f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return (DetachedStateBase *)0x0;
}

Assistant:

DetachedStateBase* JavascriptOperators::DetachVarAndGetState(Var var, bool queueForDelayFree/* = true*/)
    {
        switch (GetTypeId(var))
        {
        case TypeIds_ArrayBuffer:
            return Js::VarTo<Js::ArrayBuffer>(var)->DetachAndGetState(queueForDelayFree);
        default:
            if (!Js::VarTo<Js::RecyclableObject>(var)->IsExternal())
            {
                AssertMsg(false, "We should explicitly have a case statement for each non-external object that can be detached.");
            }
            return nullptr;
        }
    }